

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleInsert(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **__ptr;
  size_t __size;
  int iVar1;
  
  iVar1 = p->nItems;
  __ptr = p->pTree;
  if (iVar1 == p->nItemsAlloc) {
    p->nItemsAlloc = iVar1 * 2;
    __size = (long)iVar1 * 0x10 + 0x50;
    if (__ptr == (Fxu_Single **)0x0) {
      __ptr = (Fxu_Single **)malloc(__size);
    }
    else {
      __ptr = (Fxu_Single **)realloc(__ptr,__size);
      iVar1 = p->nItems;
    }
    p->pTree = __ptr;
  }
  p->nItems = iVar1 + 1;
  __ptr[(long)iVar1 + 1] = pSingle;
  pSingle->HNum = iVar1 + 1;
  Fxu_HeapSingleMoveUp(p,pSingle);
  return;
}

Assistant:

void Fxu_HeapSingleInsert( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
	if ( p->nItems == p->nItemsAlloc )
		Fxu_HeapSingleResize( p );
	// put the last entry to the last place and move up
	p->pTree[++p->nItems] = pSingle;
	pSingle->HNum = p->nItems;
	// move the last entry up if necessary
	Fxu_HeapSingleMoveUp( p, pSingle );
}